

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O3

STBase * __thiscall jbcoin::STObject::getPField(STObject *this,SField *field,bool createOkay)

{
  int iVar1;
  pointer pSVar2;
  
  iVar1 = getFieldIndex(this,field);
  if (iVar1 == -1) {
    if (!createOkay) {
      return (STBase *)0x0;
    }
    if (this->mType != (SOTemplate *)0x0) {
      return (STBase *)0x0;
    }
    std::vector<jbcoin::detail::STVar,std::allocator<jbcoin::detail::STVar>>::
    emplace_back<jbcoin::detail::defaultObject_t&,jbcoin::SField_const&>
              ((vector<jbcoin::detail::STVar,std::allocator<jbcoin::detail::STVar>> *)&this->v_,
               (defaultObject_t *)&detail::defaultObject,field);
    pSVar2 = (this->v_).
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pSVar2 = pSVar2 + ((int)((ulong)((long)(this->v_).
                                           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>
                                           ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2
                                    ) >> 5) * -0x55555555 + -1);
  }
  else {
    pSVar2 = (this->v_).
             super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
             _M_impl.super__Vector_impl_data._M_start + iVar1;
  }
  return pSVar2->p_;
}

Assistant:

STBase* STObject::getPField (SField const& field, bool createOkay)
{
    int index = getFieldIndex (field);

    if (index == -1)
    {
        if (createOkay && isFree ())
            return getPIndex(emplace_back(detail::defaultObject, field));

        return nullptr;
    }

    return getPIndex (index);
}